

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

void ws::log_helper<char_const(&)[7],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
               (Severity severity,FormatWithLoc *fmt,char (*args) [7],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               char (*args_2) [13],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  bool bVar1;
  Output OVar2;
  Logger *pLVar3;
  string local_d8;
  string local_a8;
  __impl *local_88;
  time_point local_80;
  undefined1 local_78 [8];
  Record rec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_3;
  char (*args_local_2) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [7];
  FormatWithLoc *fmt_local;
  Severity severity_local;
  
  rec.message.field_2._8_8_ = args_3;
  pLVar3 = get_logger_instance();
  OVar2 = Logger::get_mode(pLVar3);
  if (OVar2 != none) {
    local_80.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_88 = (__impl *)FormatWithLoc::get_loc(fmt);
    Record::Record((Record *)local_78,local_80,severity,(source_location)local_88);
    FormatWithLoc::get_fmt_abi_cxx11_(&local_a8,fmt);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      Record::add<char_const(&)[7],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
                ((Record *)local_78,args,args_1,args_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 rec.message.field_2._8_8_);
    }
    else {
      FormatWithLoc::get_fmt_abi_cxx11_(&local_d8,fmt);
      Record::
      add_fmt<char_const(&)[7],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
                ((Record *)local_78,&local_d8,args,args_1,args_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 rec.message.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    pLVar3 = get_logger_instance();
    Logger::add(pLVar3,(Record *)local_78);
    Record::~Record((Record *)local_78);
  }
  return;
}

Assistant:

void log_helper(Severity severity, const FormatWithLoc &fmt, Args &&...args)
  {
    if (get_logger_instance().get_mode() == Output::none)
    {
      return;
    }
    Record rec(std::chrono::system_clock::now(), severity, fmt.get_loc());
    if (fmt.get_fmt().empty())
    {
      rec.add(std::forward<Args>(args)...);
    }
    else
    {
      rec.add_fmt(fmt.get_fmt(), std::forward<Args>(args)...);
    }
    get_logger_instance().add(rec);
  }